

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpmessageunit.c
# Opt level: O1

int main(int argc,char **argv)

{
  yabmp l_instance;
  yabmp local_430;
  
  memset(&local_430,0,0x420);
  local_430.error_fn = print_error;
  local_430.warning_fn = print_warning;
  yabmp_send_warning(&local_430,"test yabmp_vsnprintf %%");
  yabmp_send_error(&local_430,"test yabmp_vsnprintf %s","string");
  yabmp_send_error(&local_430,"test yabmp_vsnprintf %s",0);
  yabmp_send_error(&local_430,"test yabmp_vsnprintf %zu",0);
  yabmp_send_error(&local_430,"test yabmp_vsnprintf %u",0);
  yabmp_send_error(&local_430,"test yabmp_vsnprintf %lu",0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	int result = EXIT_SUCCESS;
	
	yabmp l_instance = {0};
	
	l_instance.error_fn = print_error;
	l_instance.warning_fn = print_warning;
	
	/* test messages */
	{
		size_t test_size = 0U;
		unsigned int test_int = 0U;
		unsigned long test_long = 0U;
		yabmp_send_warning(&l_instance, "test yabmp_vsnprintf %%");
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %s", "string");
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %s", NULL);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %zu", test_size);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %u", test_int);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %lu", test_long);
	}
	
	return result;
	
}